

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O3

void SaveCDT_SnapshotWithPalette(path *fname,aint startAddr,byte screenMode,byte *palette)

{
  long lVar1;
  string *tfname;
  char cVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  void *__dest;
  CDevicePage *pCVar6;
  char *pcVar7;
  undefined2 uVar8;
  long lVar9;
  long lVar10;
  int i;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint uVar14;
  int num;
  byte bVar15;
  ulong uVar16;
  byte bVar17;
  word local_138;
  uchar *pages_ram [4];
  byte loader [114];
  undefined4 local_68;
  uint uStack_64;
  aint pages_start [4];
  aint pages_len [4];
  
  bVar17 = 0;
  uVar8 = (undefined2)startAddr;
  iVar5 = strcmp(DeviceID,"AMSTRADCPC464");
  __dest = operator_new__(0xc000);
  if (iVar5 == 0) {
    pCVar6 = CDevice::GetPage(Device,0);
    memcpy(__dest,pCVar6->RAM,0x4000);
    pCVar6 = CDevice::GetPage(Device,1);
    memcpy((void *)((long)__dest + 0x4000),pCVar6->RAM,0x4000);
    pCVar6 = CDevice::GetPage(Device,2);
    memcpy((void *)((long)__dest + 0x8000),pCVar6->RAM,0x4000);
    bVar15 = 0xff;
    if (screenMode < 3) {
      bVar15 = screenMode;
    }
    bVar4 = CDTUtil::hasScreen();
    lVar11 = 0;
    do {
      if (*(char *)((long)__dest + lVar11) != '\0') goto LAB_001140be;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xc000);
    lVar11 = 0x10000;
LAB_001140be:
    pcVar7 = (char *)((long)__dest + 0xbfff);
    lVar10 = 0;
    do {
      if (lVar10 == 0xc000) goto LAB_001140e7;
      lVar10 = lVar10 + 1;
      cVar2 = *pcVar7;
      pcVar7 = pcVar7 + -1;
    } while (cVar2 == '\0');
    iVar5 = (int)lVar11;
    if (iVar5 == 0x10000) {
LAB_001140e7:
      Error("[SAVECDT] Could not determine the start and end of the program",(char *)0x0,SUPPRESS);
    }
    else {
      lVar9 = (-iVar5 - lVar10) + 0xc001;
      if (startAddr < 0) {
        uVar8 = (undefined2)lVar11;
      }
      loader[0x20] = 0x80;
      loader[0x21] = '>';
      loader[0x22] = '\x16';
      loader[0x23] = 0xc3;
      loader[0x24] = 0xa1;
      loader[0x10] = '@';
      loader[0x11] = '>';
      loader[0x12] = '\x16';
      loader[0x13] = 0xcd;
      loader[0x14] = 0xa1;
      loader[0x15] = 0xbc;
      loader[0x16] = '*';
      loader[0x17] = '\'';
      loader[0x18] = 0x80;
      loader[0x19] = 0xe5;
      loader[0x1a] = '*';
      loader[0x1b] = ')';
      loader[0x1c] = 0x80;
      loader[0x1d] = 0xed;
      loader[0x1e] = '[';
      loader[0x1f] = '+';
      loader[0] = '>';
      loader[1] = 0xff;
      loader[2] = 0xcd;
      loader[3] = 'k';
      loader[4] = 0xbc;
      loader[5] = ':';
      loader[6] = '&';
      loader[7] = 0x80;
      loader[8] = 0xb7;
      loader[9] = '(';
      loader[10] = '\v';
      loader[0xb] = '!';
      loader[0xc] = '\0';
      loader[0xd] = 0xc0;
      loader[0xe] = '\x11';
      loader[0xf] = '\0';
      loader[0x26] = bVar4;
      loader[0x25] = 0xbc;
      loader[0x27] = (byte)uVar8;
      loader[0x28] = (byte)((ushort)uVar8 >> 8);
      loader[0x29] = (byte)lVar11;
      loader[0x2a] = (byte)((ulong)lVar11 >> 8);
      loader[0x2b] = ('\x01' - (byte)lVar11) - (char)lVar10;
      loader[0x2c] = (byte)((ulong)lVar9 >> 8);
      TZX_CreateEmpty(fname);
      TZX_AppendPauseBlock(fname,2000);
      CDTUtil::writeBASICLoader(fname,bVar15,palette);
      tfname = (string *)(pages_ram + 2);
      pages_ram[2]._0_4_ = 0x45444f43;
      pages_ram[1] = (uchar *)0x4;
      pages_ram[2]._4_4_ = pages_ram[2]._4_4_ & 0xffffff00;
      pages_ram[0] = (uchar *)tfname;
      CDTUtil::writeTapeFile(fname,tfname,'\x04',(byte *)0x2,(aint)loader,0x2d,0x8000,0x8000);
      if ((string *)pages_ram[0] != tfname) {
        operator_delete(pages_ram[0],CONCAT44(pages_ram[2]._4_4_,pages_ram[2]._0_4_) + 1);
      }
      if (bVar4) {
        pCVar6 = CDevice::GetPage(Device,3);
        pbVar12 = pCVar6->RAM;
        pCVar6 = CDevice::GetPage(Device,3);
        CDTUtil::writeChunkedData(fname,pbVar12,pCVar6->Size,1000,'\x16');
      }
      CDTUtil::writeChunkedData(fname,(byte *)((long)__dest + (long)iVar5),(aint)lVar9,1000,'\x16');
    }
  }
  else {
    pCVar6 = CDevice::GetPage(Device,0);
    memcpy(__dest,pCVar6->RAM,0x4000);
    pCVar6 = CDevice::GetPage(Device,1);
    memcpy((void *)((long)__dest + 0x4000),pCVar6->RAM,0x4000);
    pCVar6 = CDevice::GetPage(Device,2);
    memcpy((void *)((long)__dest + 0x8000),pCVar6->RAM,0x4000);
    bVar15 = 0xff;
    if (screenMode < 3) {
      bVar15 = screenMode;
    }
    bVar4 = CDTUtil::hasScreen();
    lVar11 = 0;
    do {
      if (*(char *)((long)__dest + lVar11) != '\0') goto LAB_00113fd7;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xc000);
    lVar11 = 0x10000;
LAB_00113fd7:
    pcVar7 = (char *)((long)__dest + 0xbfff);
    lVar10 = 0;
    do {
      if (lVar10 == 0xc000) goto LAB_00114001;
      lVar10 = lVar10 + 1;
      cVar2 = *pcVar7;
      pcVar7 = pcVar7 + -1;
    } while (cVar2 == '\0');
    iVar5 = (int)lVar11;
    if (iVar5 == 0x10000) {
LAB_00114001:
      Error("[SAVECDT] Could not determine the start and end of the program",(char *)0x0,SUPPRESS);
    }
    else {
      pbVar12 = SaveCDT_AmstradCPC6128;
      pbVar13 = loader;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined8 *)pbVar13 = *(undefined8 *)pbVar12;
        pbVar12 = pbVar12 + ((ulong)bVar17 * -2 + 1) * 8;
        pbVar13 = pbVar13 + (ulong)bVar17 * -0x10 + 8;
      }
      lVar9 = (-iVar5 - lVar10) + 0xc001;
      if (startAddr < 0) {
        uVar8 = (undefined2)lVar11;
      }
      loader[0x57] = (byte)uVar8;
      loader[0x59] = (byte)lVar11;
      loader[0x58] = (byte)((ushort)uVar8 >> 8);
      loader[0x5a] = (byte)((ulong)lVar11 >> 8);
      loader[0x5b] = ('\x01' - (byte)lVar11) - (char)lVar10;
      loader[0x5d] = '\0';
      loader[0x5c] = (byte)((ulong)lVar9 >> 8);
      loader[0x56] = bVar4;
      if (Device->PagesCount < 5) {
        uVar14 = 0;
        local_138 = 0x5e;
      }
      else {
        local_138 = 0x5e;
        uVar14 = 0;
        num = 4;
        pbVar12 = loader + 0x5e;
        do {
          pCVar6 = CDevice::GetPage(Device,num);
          lVar11 = 0;
          do {
            if (pCVar6->RAM[lVar11] != '\0') goto LAB_001141cd;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x4000);
          lVar11 = 0x10000;
LAB_001141cd:
          pCVar6 = CDevice::GetPage(Device,num);
          lVar10 = 0x4001;
          do {
            if (lVar10 == 1) goto LAB_00114251;
            lVar1 = lVar10 + -1;
            lVar3 = lVar10 + -2;
            lVar10 = lVar1;
          } while (pCVar6->RAM[lVar3] == '\0');
          if ((int)lVar11 != 0x10000) {
            *pbVar12 = (byte)num;
            pbVar12[1] = (byte)lVar11;
            pbVar12[2] = (byte)((ulong)lVar11 >> 8);
            pbVar12[3] = (byte)lVar1;
            pbVar12[4] = (byte)((ulong)lVar1 >> 8);
            pCVar6 = CDevice::GetPage(Device,num);
            pbVar12 = pbVar12 + 5;
            local_138 = local_138 + 5;
            pages_ram[(int)uVar14] = pCVar6->RAM;
            pages_start[(int)uVar14] = (int)lVar11;
            pages_len[(int)uVar14] = (aint)lVar1;
            uVar14 = uVar14 + 1;
          }
LAB_00114251:
          num = num + 1;
        } while (num < Device->PagesCount);
      }
      loader[0x5d] = (byte)uVar14;
      TZX_CreateEmpty(fname);
      TZX_AppendPauseBlock(fname,2000);
      CDTUtil::writeBASICLoader(fname,bVar15,palette);
      local_68 = 0x45444f43;
      uStack_64 = uStack_64 & 0xffffff00;
      CDTUtil::writeTapeFile
                (fname,(string *)&stack0xffffffffffffff98,'\x04',(byte *)0x2,(aint)loader,local_138,
                 0x8000,0x8000);
      if (bVar4) {
        pCVar6 = CDevice::GetPage(Device,3);
        pbVar12 = pCVar6->RAM;
        pCVar6 = CDevice::GetPage(Device,3);
        CDTUtil::writeChunkedData(fname,pbVar12,pCVar6->Size,1000,'\x16');
      }
      if (0 < (int)uVar14) {
        uVar16 = 0;
        do {
          CDTUtil::writeChunkedData
                    (fname,pages_ram[uVar16] + pages_start[uVar16],pages_len[uVar16],1000,'\x16');
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      CDTUtil::writeChunkedData(fname,(byte *)((long)__dest + (long)iVar5),(aint)lVar9,1000,'\x16');
    }
  }
  operator_delete__(__dest);
  return;
}

Assistant:

static void SaveCDT_SnapshotWithPalette(const std::filesystem::path & fname,
										aint startAddr, byte screenMode, const byte* palette)
{
	isCPC6128() ?
		createCDTDump6128(fname, startAddr, screenMode, palette) :
		createCDTDump464(fname, startAddr, screenMode, palette);
}